

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  char *pcVar1;
  EnumValueDescriptor *pEVar2;
  long lVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  EnumDescriptor *pEVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar5;
  Nonnull<const_char_*> failure_msg;
  ulong uVar6;
  long lVar7;
  long v1;
  string_view element_name;
  string_view element_name_00;
  anon_class_24_3_0c655f7d make_error;
  EnumValueDescriptor *enum_value;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  insert_result;
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  EnumDescriptor *local_d8;
  undefined4 local_cc;
  EnumDescriptorProto *local_c8;
  DescriptorBuilder *local_c0;
  _Head_base<0UL,_int_&&,_false> local_b8;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false> local_b0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_90;
  VoidPtr local_78;
  code *pcStack_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  local_d8 = enm;
  local_c8 = proto;
  local_c0 = this;
  CheckEnumValueUniqueness(this,proto,enm);
  if ((((local_d8->merged_features_->field_0)._impl_.enum_type_ != 2) &&
      (0 < local_d8->value_count_)) && (local_d8->values_->number_ != 0)) {
    pcVar1 = (local_d8->all_names_).payload_;
    uVar6 = (ulong)*(ushort *)(pcVar1 + 2);
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&(local_c8->field_0)._impl_.value_.super_RepeatedPtrFieldBase,0);
    element_name._M_str = pcVar1 + ~uVar6;
    element_name._M_len = uVar6;
    AddError(local_c0,element_name,&pVVar5->super_Message,NUMBER,
             "The first enum value must be zero for open enums.");
  }
  if (((*(byte *)((long)&local_d8->options_->field_0 + 0x18) & 2) == 0) ||
     ((local_d8->options_->field_0)._impl_.allow_alias_ == false)) {
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    if (0 < local_d8->value_count_) {
      local_c8 = (EnumDescriptorProto *)&(local_c8->field_0)._impl_.value_;
      lVar7 = 0;
      v1 = 0;
      do {
        pEVar4 = local_d8;
        if (v1 < local_d8->value_count_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1,(long)local_d8->value_count_,"index < value_count()");
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xabb,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_90);
        }
        pEVar2 = pEVar4->values_;
        local_a0._M_len = (size_t)(&pEVar2->super_SymbolBaseN<0> + lVar7);
        local_cc = *(undefined4 *)((long)&pEVar2->number_ + lVar7);
        lVar3 = *(long *)((long)&pEVar2->all_names_ + lVar7);
        local_68._M_str = *(char **)(lVar3 + 0x20);
        local_68._M_len = *(size_t *)(lVar3 + 0x28);
        local_b0._M_head_impl = &local_68;
        local_b8._M_head_impl = &local_cc;
        local_a0._M_str = (char *)&local_58;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  (&local_90,&local_a0._M_str,&local_cc,
                   (piecewise_construct_t *)&std::piecewise_construct,(tuple<int_&&> *)&local_b8,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_b0);
        if ((local_90.second == false) &&
           ((local_d8->options_->field_0)._impl_.allow_alias_ == false)) {
          local_b8._M_head_impl = (int *)&local_d8;
          local_b0._M_head_impl = &local_a0;
          local_a8 = &local_90;
          pcVar1 = (local_d8->all_names_).payload_;
          uVar6 = (ulong)*(ushort *)(pcVar1 + 2);
          pVVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                             ((RepeatedPtrFieldBase *)local_c8,(int)v1);
          pcStack_70 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          local_78.obj = &local_b8;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = local_78.obj;
          element_name_00._M_str = pcVar1 + ~uVar6;
          element_name_00._M_len = uVar6;
          AddError(local_c0,element_name_00,&pVVar5->super_Message,NUMBER,make_error_00);
        }
        v1 = v1 + 1;
        lVar7 = lVar7 + 0x30;
      } while (v1 < local_d8->value_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set(&local_58);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const EnumDescriptor* enm,
                                        const EnumDescriptorProto& proto) {
  CheckEnumValueUniqueness(proto, enm);

  if (!enm->is_closed() && enm->value_count() > 0 &&
      enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero for open enums.");
  }

  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    absl::flat_hash_map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      auto insert_result =
          used_values.emplace(enum_value->number(), enum_value->full_name());
      bool inserted = insert_result.second;
      if (!inserted) {
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          auto make_error = [&] {
            // Find the next free number.
            absl::flat_hash_set<int64_t> used;
            for (int j = 0; j < enm->value_count(); ++j) {
              used.insert(enm->value(j)->number());
            }
            int64_t next_value = static_cast<int64_t>(enum_value->number()) + 1;
            while (used.contains(next_value)) ++next_value;

            std::string error = absl::StrCat(
                "\"", enum_value->full_name(),
                "\" uses the same enum value as \"",
                insert_result.first->second,
                "\". If this is intended, set "
                "'option allow_alias = true;' to the enum definition.");
            if (next_value < std::numeric_limits<int32_t>::max()) {
              absl::StrAppend(&error, " The next available enum value is ",
                              next_value, ".");
            }
            return error;
          };
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
        }
      }
    }
  }
}